

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O2

int stopcheck2(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol
              ,double stol)

{
  double *array;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  array = (double *)malloc((long)N * 8);
  dVar5 = ABS(fx);
  if (ABS(fx) <= ABS(fsval)) {
    dVar5 = ABS(fsval);
  }
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar4 = ABS(xf[uVar1]);
    if (ABS(xf[uVar1]) <= 1.0 / ABS(dx[uVar1])) {
      dVar4 = 1.0 / ABS(dx[uVar1]);
    }
    array[uVar1] = (ABS(jac[uVar1]) * dVar4) / dVar5;
  }
  dVar5 = array_max_abs(array,N);
  if (dVar5 <= gtol) {
    iVar3 = 1;
  }
  else {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      dVar5 = ABS(xf[uVar1]);
      if (dVar5 <= 1.0 / ABS(dx[uVar1])) {
        dVar5 = 1.0 / ABS(dx[uVar1]);
      }
      array[uVar1] = ABS(xf[uVar1] - xc[uVar1]) / dVar5;
    }
    dVar5 = array_max_abs(array,N);
    iVar3 = 0;
    if (dVar5 <= stol) {
      iVar3 = 2;
    }
  }
  free(array);
  return iVar3;
}

Assistant:

int stopcheck2(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol,double stol) {
	int rcode,i;
	double num,den;
	double stop0;
	double *scheck;
	
	rcode = 0;	
	
	scheck = (double*) malloc(sizeof(double) *N);
	
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xf[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol) {
		rcode = 1;
	} else {
		for(i = 0; i < N;++i) {
			if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
				den = fabs(xf[i]);
			} else {
				den = 1.0 / fabs(dx[i]);
			}
			num = fabs(xf[i] - xc[i]);
			scheck[i] = num / den;
		}
		stop0 = array_max_abs(scheck,N);
		if (stop0 <= stol) {
			rcode = 2;
		}
	}
	
	free(scheck);
	return rcode;
}